

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileutil.h
# Opt level: O0

File * ctemplate::File::Open(char *filename,char *mode)

{
  FILE *fp_00;
  FILE *fp;
  char *mode_to_use;
  char *pcStack_20;
  char binary_mode [3];
  char *mode_local;
  char *filename_local;
  
  fp = (FILE *)mode;
  if (((*mode == 'r') || (*mode == 'w')) && (mode[1] == '\0')) {
    mode_to_use._5_1_ = *mode;
    mode_to_use._6_1_ = 0x62;
    mode_to_use._7_1_ = 0;
    fp = (FILE *)((long)&mode_to_use + 5);
  }
  pcStack_20 = mode;
  fp_00 = fopen(filename,(char *)fp);
  if (fp_00 == (FILE *)0x0) {
    filename_local = (char *)0x0;
  }
  else {
    filename_local = (char *)operator_new(8);
    File((File *)filename_local,(FILE *)fp_00);
  }
  return (File *)filename_local;
}

Assistant:

static File* Open(const char* filename, const char* mode) {
    char binary_mode[3];
    const char* mode_to_use = mode;
    if ((mode[0] == 'r' || mode[0] == 'w') && mode[1] == '\0') {
      // We add a 'b' to make sure we do the right thing even on
      // Windows.  On unix, this will be a noop.
      binary_mode[0] = mode[0];
      binary_mode[1] = 'b';
      binary_mode[2] = '\0';
      mode_to_use = binary_mode;
    }
    FILE* fp = fopen(filename, mode_to_use);
    if (!fp)  return NULL;
    return new File(fp);
  }